

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mondata.c
# Opt level: O3

char * stagger(permonst *ptr,char *def)

{
  char c;
  uint uVar1;
  char cVar2;
  char **ppcVar3;
  
  c = *def;
  cVar2 = highc(c);
  if (ptr->mlet == '\x05') {
    ppcVar3 = levitate;
  }
  else {
    uVar1 = ptr->mflags1;
    if ((uVar1 & 1) == 0) {
      if ((uVar1 >> 0x13 & 1) == 0) {
        if ((uVar1 & 4) == 0) {
          if (ptr->mmove == '\0') {
            ppcVar3 = immobile;
          }
          else {
            if ((~uVar1 & 0x6000) != 0) {
              return def;
            }
            ppcVar3 = crawl;
          }
        }
        else {
          ppcVar3 = ooze;
        }
      }
      else {
        ppcVar3 = slither;
      }
    }
    else if (ptr->msize < 2) {
      ppcVar3 = flys;
    }
    else {
      ppcVar3 = flyl;
    }
  }
  return ppcVar3[c == cVar2 | 2];
}

Assistant:

const char *stagger(const struct permonst *ptr, const char *def)
{
	int capitalize = 2 + (*def == highc(*def));

	return (
		is_floater(ptr) ? levitate[capitalize] :
		(is_flyer(ptr) && ptr->msize <= MZ_SMALL) ? flys[capitalize] :
		(is_flyer(ptr) && ptr->msize > MZ_SMALL)  ? flyl[capitalize] :
		slithy(ptr)     ? slither[capitalize] :
		amorphous(ptr)  ? ooze[capitalize] :
		!ptr->mmove	? immobile[capitalize] :
		nolimbs(ptr)    ? crawl[capitalize] :
		def
	       );

}